

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Integer MA_sizeof(Integer datatype1,Integer nelem1,Integer datatype2)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int ceiling;
  ulongi source_bytes;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  long local_8;
  
  ma_stats.calls[0x1c] = ma_stats.calls[0x1c] + 1;
  ma_preinitialize((char *)0x1b2721);
  if ((in_RDI < 1000) || (0x3f8 < in_RDI)) {
    sprintf(ma_ebuf,"invalid datatype: %ld",in_RDI);
    ma_error((ErrorLevel)((ulong)in_RDX >> 0x20),(ErrorType)in_RDX,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    local_8 = 0;
  }
  else if (in_RSI < 0) {
    sprintf(ma_ebuf,"invalid nelem: %ld",in_RSI);
    ma_error((ErrorLevel)((ulong)in_RDX >> 0x20),(ErrorType)in_RDX,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    local_8 = 0;
  }
  else if ((in_RDX < 1000) || (0x3f8 < in_RDX)) {
    sprintf(ma_ebuf,"invalid datatype: %ld",in_RDX);
    ma_error((ErrorLevel)((ulong)in_RDX >> 0x20),(ErrorType)in_RDX,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    local_8 = 0;
  }
  else {
    local_8 = (ulong)(in_RSI * ma_sizeof[in_RDI + -1000]) / (ulong)(long)ma_sizeof[in_RDX + -1000] +
              (long)(int)(uint)((ulong)(in_RSI * ma_sizeof[in_RDI + -1000]) %
                                (ulong)(long)ma_sizeof[in_RDX + -1000] != 0);
  }
  return local_8;
}

Assistant:

public Integer MA_sizeof(
    Integer    datatype1,    /* of source elements */
    Integer    nelem1,        /* # of source elements */
    Integer    datatype2     /* of target elements */)
{
    ulongi    source_bytes;    /* nelem1 * ma_sizeof[datatype1] */
    int        ceiling;    /* 1 iff ceiling alters result */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_sizeof]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return DONTCARE;
#endif /* VERIFY */

    /* preinitialize if necessary */
    ma_preinitialize("MA_sizeof");

    /* verify datatype1 */
    if (!mt_valid(datatype1))
    {
        (void)sprintf(ma_ebuf,
            "invalid datatype: %ld",
            (size_t)datatype1);
        ma_error(EL_Fatal, ET_External, "MA_sizeof", ma_ebuf);
        return DONTCARE;
    }

    /* verify nelem1 */
    if (nelem1 < 0)
    {
        (void)sprintf(ma_ebuf,
            "invalid nelem: %ld",
            (size_t)nelem1);
        ma_error(EL_Fatal, ET_External, "MA_sizeof", ma_ebuf);
        return DONTCARE;
    }

    /* verify datatype2 */
    if (!mt_valid(datatype2))
    {
        (void)sprintf(ma_ebuf,
            "invalid datatype: %ld",
            (size_t)datatype2);
        ma_error(EL_Fatal, ET_External, "MA_sizeof", ma_ebuf);
        return DONTCARE;
    }

    /* convert datatype1 to internal (index-suitable) value */
    datatype1 = mt_import(datatype1);

    /* convert datatype2 to internal (index-suitable) value */
    datatype2 = mt_import(datatype2);

    /* compute and return the result */
    source_bytes = nelem1 * ma_sizeof[datatype1];
    ceiling = (source_bytes % ma_sizeof[datatype2]) ? 1 : 0;
    return (Integer)((source_bytes / ma_sizeof[datatype2]) + ceiling);
}